

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O3

void __thiscall
vsencoding::VSEncodingBlocks::encodeVS
          (VSEncodingBlocks *this,uint32_t len,uint32_t *in,uint32_t *size,uint32_t *out)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  byte bVar4;
  byte bVar5;
  ulong uVar6;
  uint32_t *puVar7;
  long *plVar8;
  long lVar9;
  void *pvVar10;
  uint uVar11;
  uint32_t *puVar12;
  uint uVar13;
  uint32_t *puVar14;
  uint32_t *puVar15;
  uint32_t uVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  uint32_t uVar21;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  int *piVar28;
  ushort uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  uint32_t numBlocks;
  uint32_t countBlocksLogs [16];
  uint32_t blockCur [16];
  uint32_t *blocks [16];
  uint local_154;
  uint32_t *local_150;
  uint32_t *local_148;
  uint32_t *local_140;
  uint local_138;
  undefined1 auStack_134 [60];
  uint local_f8;
  undefined1 auStack_f4 [60];
  long local_b8 [17];
  
  local_148 = size;
  local_150 = (uint32_t *)operator_new__((ulong)len * 4);
  if (len != 0) {
    uVar6 = 0;
    do {
      uVar11 = in[uVar6];
      if (uVar11 == 0) {
        uVar22 = 1;
      }
      else {
        iVar17 = 0x1f;
        if (uVar11 != 0) {
          for (; uVar11 >> iVar17 == 0; iVar17 = iVar17 + -1) {
          }
        }
        uVar22 = (ulong)(iVar17 + 2);
      }
      local_150[uVar6] = *(uint32_t *)(__vseblocks_remapLogs + uVar22 * 4);
      uVar6 = uVar6 + 1;
    } while (len != uVar6);
  }
  local_140 = in;
  puVar7 = VSEncoding::compute_OptPartition(__vseblocks,local_150,len,8,&local_154);
  plVar8 = (long *)operator_new(0x20);
  auVar32 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  local_138 = auVar32._0_4_;
  auStack_134 = auVar32._4_60_;
  auVar32 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  local_f8 = auVar32._0_4_;
  auStack_f4 = auVar32._4_60_;
  if ((ulong)local_154 != 0) {
    auVar32 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar33 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    uVar6 = 0;
    uVar16 = *puVar7;
    do {
      uVar11 = puVar7[uVar6 + 1];
      if (uVar16 < uVar11) {
        auVar41 = ZEXT1664((undefined1  [16])0x0);
        auVar34 = vpbroadcastq_avx512f();
        uVar22 = ((ulong)uVar11 - (ulong)uVar16) + 0xf & 0xfffffffffffffff0;
        uVar25 = 0;
        do {
          auVar35 = vpbroadcastq_avx512f();
          auVar36 = vmovdqa64_avx512f(auVar41);
          auVar41 = vporq_avx512f(auVar35,auVar32);
          auVar35 = vporq_avx512f(auVar35,auVar33);
          uVar3 = vpcmpuq_avx512f(auVar35,auVar34,2);
          bVar4 = (byte)uVar3;
          uVar3 = vpcmpuq_avx512f(auVar41,auVar34,2);
          bVar5 = (byte)uVar3;
          uVar29 = CONCAT11(bVar5,bVar4);
          auVar41 = vmovdqu32_avx512f(*(undefined1 (*) [64])(local_150 + uVar16 + uVar25));
          auVar35._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * auVar41._4_4_;
          auVar35._0_4_ = (uint)(bVar4 & 1) * auVar41._0_4_;
          auVar35._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * auVar41._8_4_;
          auVar35._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * auVar41._12_4_;
          auVar35._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar41._16_4_;
          auVar35._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar41._20_4_;
          auVar35._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar41._24_4_;
          auVar35._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar41._28_4_;
          auVar35._32_4_ = (uint)(bVar5 & 1) * auVar41._32_4_;
          auVar35._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar41._36_4_;
          auVar35._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar41._40_4_;
          auVar35._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar41._44_4_;
          auVar35._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar41._48_4_;
          auVar35._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar41._52_4_;
          auVar35._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar41._56_4_;
          auVar35._60_4_ = (uint)(bVar5 >> 7) * auVar41._60_4_;
          uVar25 = uVar25 + 0x10;
          auVar41 = vpmaxud_avx512f(auVar36,auVar35);
        } while (uVar22 != uVar25);
        auVar34 = vmovdqa32_avx512f(auVar41);
        auVar41._0_4_ = (uint)(bVar4 & 1) * auVar34._0_4_ | (uint)!(bool)(bVar4 & 1) * auVar36._0_4_
        ;
        bVar1 = (bool)((byte)(uVar29 >> 1) & 1);
        auVar41._4_4_ = (uint)bVar1 * auVar34._4_4_ | (uint)!bVar1 * auVar36._4_4_;
        bVar1 = (bool)((byte)(uVar29 >> 2) & 1);
        auVar41._8_4_ = (uint)bVar1 * auVar34._8_4_ | (uint)!bVar1 * auVar36._8_4_;
        bVar1 = (bool)((byte)(uVar29 >> 3) & 1);
        auVar41._12_4_ = (uint)bVar1 * auVar34._12_4_ | (uint)!bVar1 * auVar36._12_4_;
        bVar1 = (bool)((byte)(uVar29 >> 4) & 1);
        auVar41._16_4_ = (uint)bVar1 * auVar34._16_4_ | (uint)!bVar1 * auVar36._16_4_;
        bVar1 = (bool)((byte)(uVar29 >> 5) & 1);
        auVar41._20_4_ = (uint)bVar1 * auVar34._20_4_ | (uint)!bVar1 * auVar36._20_4_;
        bVar1 = (bool)((byte)(uVar29 >> 6) & 1);
        auVar41._24_4_ = (uint)bVar1 * auVar34._24_4_ | (uint)!bVar1 * auVar36._24_4_;
        bVar1 = (bool)((byte)(uVar29 >> 7) & 1);
        auVar41._28_4_ = (uint)bVar1 * auVar34._28_4_ | (uint)!bVar1 * auVar36._28_4_;
        auVar41._32_4_ =
             (uint)(bVar5 & 1) * auVar34._32_4_ | (uint)!(bool)(bVar5 & 1) * auVar36._32_4_;
        bVar1 = (bool)(bVar5 >> 1 & 1);
        auVar41._36_4_ = (uint)bVar1 * auVar34._36_4_ | (uint)!bVar1 * auVar36._36_4_;
        bVar1 = (bool)(bVar5 >> 2 & 1);
        auVar41._40_4_ = (uint)bVar1 * auVar34._40_4_ | (uint)!bVar1 * auVar36._40_4_;
        bVar1 = (bool)(bVar5 >> 3 & 1);
        auVar41._44_4_ = (uint)bVar1 * auVar34._44_4_ | (uint)!bVar1 * auVar36._44_4_;
        bVar1 = (bool)(bVar5 >> 4 & 1);
        auVar41._48_4_ = (uint)bVar1 * auVar34._48_4_ | (uint)!bVar1 * auVar36._48_4_;
        bVar1 = (bool)(bVar5 >> 5 & 1);
        auVar41._52_4_ = (uint)bVar1 * auVar34._52_4_ | (uint)!bVar1 * auVar36._52_4_;
        bVar1 = (bool)(bVar5 >> 6 & 1);
        auVar41._56_4_ = (uint)bVar1 * auVar34._56_4_ | (uint)!bVar1 * auVar36._56_4_;
        auVar41._60_4_ =
             (uint)(bVar5 >> 7) * auVar34._60_4_ | (uint)!(bool)(bVar5 >> 7) * auVar36._60_4_;
        auVar31 = vextracti64x4_avx512f(auVar41,1);
        auVar34 = vpmaxud_avx512f(auVar41,ZEXT3264(auVar31));
        auVar30 = vpmaxud_avx(auVar34._0_16_,auVar34._16_16_);
        auVar2 = vpshufd_avx(auVar30,0xee);
        auVar30 = vpmaxud_avx(auVar30,auVar2);
        auVar2 = vpshufd_avx(auVar30,0x55);
        auVar30 = vpmaxud_avx(auVar30,auVar2);
        lVar9 = CONCAT44((int)(uVar22 >> 0x20),auVar30._0_4_);
      }
      else {
        lVar9 = 0;
      }
      uVar6 = uVar6 + 1;
      *(uint *)(auStack_134 + (ulong)(uint)(&__vseblocks_codeLogs)[lVar9] * 4 + -4) =
           *(int *)(auStack_134 + (ulong)(uint)(&__vseblocks_codeLogs)[lVar9] * 4 + -4) +
           (uVar11 - uVar16);
      uVar16 = uVar11;
    } while (uVar6 != local_154);
  }
  puVar15 = out + 1;
  uVar6 = 0;
  lVar9 = 1;
  auVar32._60_4_ = local_f8;
  auVar32._0_60_ = auStack_134;
  auVar32 = vmovdqu32_avx512f(auVar32);
  auVar33._0_60_ = auVar32._0_60_;
  auVar33._60_4_ = 0;
  uVar3 = vptestmd_avx512f(auVar33,auVar33);
  auVar32 = vpmovm2d_avx512dq(uVar3);
  auVar32 = vpsrld_avx512f(auVar32,0x1f);
  auVar32 = vpexpandd_avx512f(auVar32);
  auVar34._0_60_ = auVar32._0_60_;
  auVar34._60_4_ = 0;
  auVar30 = vpmovdb_avx512f(auVar34);
  auVar30 = vpsadbw_avx(auVar30,(undefined1  [16])0x0);
  auVar2 = vpshufd_avx(auVar30,0xee);
  auVar30 = vpaddq_avx(auVar30,auVar2);
  uVar22 = CONCAT44((int)((ulong)puVar7 >> 0x20),auVar30._0_4_);
  plVar8[2] = uVar22;
  *plVar8 = (long)puVar15;
  *out = auVar30._0_4_;
  uVar16 = 1;
  *(undefined4 *)(plVar8 + 3) = 1;
  *(undefined4 *)(plVar8 + 1) = 0;
  do {
    if (*(uint *)(auStack_134 + lVar9 * 4 + -4) != 0) {
      uVar13 = (int)uVar6 + 0x1c;
      uVar11 = *(uint *)(auStack_134 + lVar9 * 4 + -4) & 0xfffffff;
      *(uint *)(plVar8 + 1) = uVar13;
      puVar14 = puVar15;
      if (0x1f < uVar13) {
        puVar14 = puVar15 + 1;
        *plVar8 = (long)puVar14;
        *puVar15 = (uint32_t)
                   ((uVar22 << 0x1c | (ulong)uVar11) >> ((ulong)(byte)((char)uVar6 - 4) & 0x3f));
        uVar16 = (int)plVar8[3] + 1;
        uVar13 = (int)plVar8[1] - 0x20;
        *(uint32_t *)(plVar8 + 3) = uVar16;
      }
      uVar18 = uVar13 + 4;
      uVar6 = (ulong)uVar18;
      uVar22 = (uVar22 << 0x20 | (ulong)(uVar11 << 4)) + lVar9;
      plVar8[2] = uVar22;
      *(uint *)(plVar8 + 1) = uVar18;
      puVar15 = puVar14;
      if (0x1f < uVar18) {
        puVar15 = puVar14 + 1;
        *plVar8 = (long)puVar15;
        *puVar14 = (uint32_t)(uVar22 >> ((ulong)(byte)((char)uVar13 - 0x1c) & 0x3f));
        uVar16 = (int)plVar8[3] + 1;
        uVar11 = (int)plVar8[1] - 0x20;
        uVar6 = (ulong)uVar11;
        *(uint32_t *)(plVar8 + 3) = uVar16;
        *(uint *)(plVar8 + 1) = uVar11;
      }
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x10);
  lVar9 = 1;
  local_b8[0] = 0;
  do {
    if ((ulong)*(uint *)(auStack_134 + lVar9 * 4 + -4) == 0) {
      pvVar10 = (void *)0x0;
    }
    else {
      pvVar10 = operator_new__((ulong)*(uint *)(auStack_134 + lVar9 * 4 + -4) << 2);
    }
    puVar14 = local_150;
    local_b8[lVar9] = (long)pvVar10;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x10);
  if (local_154 != 0) {
    auVar32 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar33 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    uVar21 = *puVar7;
    uVar25 = 0;
    do {
      uVar11 = puVar7[uVar25 + 1];
      uVar25 = uVar25 + 1;
      if (uVar21 < uVar11) {
        uVar20 = (ulong)uVar21;
        auVar41 = ZEXT1664((undefined1  [16])0x0);
        uVar27 = 0;
        auVar34 = vpbroadcastq_avx512f();
        do {
          auVar35 = vpbroadcastq_avx512f();
          auVar36 = vmovdqa64_avx512f(auVar41);
          auVar41 = vporq_avx512f(auVar35,auVar32);
          auVar35 = vporq_avx512f(auVar35,auVar33);
          uVar3 = vpcmpuq_avx512f(auVar35,auVar34,2);
          bVar4 = (byte)uVar3;
          uVar3 = vpcmpuq_avx512f(auVar41,auVar34,2);
          bVar5 = (byte)uVar3;
          uVar29 = CONCAT11(bVar5,bVar4);
          auVar41 = vmovdqu32_avx512f(*(undefined1 (*) [64])(local_150 + uVar20 + uVar27));
          auVar37._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * auVar41._4_4_;
          auVar37._0_4_ = (uint)(bVar4 & 1) * auVar41._0_4_;
          auVar37._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * auVar41._8_4_;
          auVar37._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * auVar41._12_4_;
          auVar37._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar41._16_4_;
          auVar37._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar41._20_4_;
          auVar37._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar41._24_4_;
          auVar37._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar41._28_4_;
          auVar37._32_4_ = (uint)(bVar5 & 1) * auVar41._32_4_;
          auVar37._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar41._36_4_;
          auVar37._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar41._40_4_;
          auVar37._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar41._44_4_;
          auVar37._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar41._48_4_;
          auVar37._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar41._52_4_;
          auVar37._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar41._56_4_;
          auVar37._60_4_ = (uint)(bVar5 >> 7) * auVar41._60_4_;
          uVar27 = uVar27 + 0x10;
          auVar41 = vpmaxud_avx512f(auVar36,auVar37);
        } while (((uVar11 - uVar20) + 0xf & 0xfffffffffffffff0) != uVar27);
        auVar34 = vmovdqa32_avx512f(auVar41);
        auVar38._0_4_ = (uint)(bVar4 & 1) * auVar34._0_4_ | (uint)!(bool)(bVar4 & 1) * auVar36._0_4_
        ;
        bVar1 = (bool)((byte)(uVar29 >> 1) & 1);
        auVar38._4_4_ = (uint)bVar1 * auVar34._4_4_ | (uint)!bVar1 * auVar36._4_4_;
        bVar1 = (bool)((byte)(uVar29 >> 2) & 1);
        auVar38._8_4_ = (uint)bVar1 * auVar34._8_4_ | (uint)!bVar1 * auVar36._8_4_;
        bVar1 = (bool)((byte)(uVar29 >> 3) & 1);
        auVar38._12_4_ = (uint)bVar1 * auVar34._12_4_ | (uint)!bVar1 * auVar36._12_4_;
        bVar1 = (bool)((byte)(uVar29 >> 4) & 1);
        auVar38._16_4_ = (uint)bVar1 * auVar34._16_4_ | (uint)!bVar1 * auVar36._16_4_;
        bVar1 = (bool)((byte)(uVar29 >> 5) & 1);
        auVar38._20_4_ = (uint)bVar1 * auVar34._20_4_ | (uint)!bVar1 * auVar36._20_4_;
        bVar1 = (bool)((byte)(uVar29 >> 6) & 1);
        auVar38._24_4_ = (uint)bVar1 * auVar34._24_4_ | (uint)!bVar1 * auVar36._24_4_;
        bVar1 = (bool)((byte)(uVar29 >> 7) & 1);
        auVar38._28_4_ = (uint)bVar1 * auVar34._28_4_ | (uint)!bVar1 * auVar36._28_4_;
        auVar38._32_4_ =
             (uint)(bVar5 & 1) * auVar34._32_4_ | (uint)!(bool)(bVar5 & 1) * auVar36._32_4_;
        bVar1 = (bool)(bVar5 >> 1 & 1);
        auVar38._36_4_ = (uint)bVar1 * auVar34._36_4_ | (uint)!bVar1 * auVar36._36_4_;
        bVar1 = (bool)(bVar5 >> 2 & 1);
        auVar38._40_4_ = (uint)bVar1 * auVar34._40_4_ | (uint)!bVar1 * auVar36._40_4_;
        bVar1 = (bool)(bVar5 >> 3 & 1);
        auVar38._44_4_ = (uint)bVar1 * auVar34._44_4_ | (uint)!bVar1 * auVar36._44_4_;
        bVar1 = (bool)(bVar5 >> 4 & 1);
        auVar38._48_4_ = (uint)bVar1 * auVar34._48_4_ | (uint)!bVar1 * auVar36._48_4_;
        bVar1 = (bool)(bVar5 >> 5 & 1);
        auVar38._52_4_ = (uint)bVar1 * auVar34._52_4_ | (uint)!bVar1 * auVar36._52_4_;
        bVar1 = (bool)(bVar5 >> 6 & 1);
        auVar38._56_4_ = (uint)bVar1 * auVar34._56_4_ | (uint)!bVar1 * auVar36._56_4_;
        auVar38._60_4_ =
             (uint)(bVar5 >> 7) * auVar34._60_4_ | (uint)!(bool)(bVar5 >> 7) * auVar36._60_4_;
        auVar31 = vextracti64x4_avx512f(auVar38,1);
        auVar34 = vpmaxud_avx512f(auVar38,ZEXT3264(auVar31));
        auVar30 = vpmaxud_avx(auVar34._0_16_,auVar34._16_16_);
        auVar2 = vpshufd_avx(auVar30,0xee);
        auVar30 = vpmaxud_avx(auVar30,auVar2);
        auVar2 = vpshufd_avx(auVar30,0x55);
        auVar30 = vpmaxud_avx(auVar30,auVar2);
        if ((auVar30._0_4_ != 0) && (uVar21 < uVar11)) {
          uVar27 = (ulong)(uint)(&__vseblocks_codeLogs)[auVar30._0_4_];
          lVar9 = local_b8[uVar27];
          uVar13 = *(uint *)(auStack_f4 + uVar27 * 4 + -4);
          do {
            puVar12 = local_140 + uVar20;
            uVar26 = (ulong)uVar13;
            uVar13 = uVar13 + 1;
            uVar20 = uVar20 + 1;
            *(uint32_t *)(lVar9 + uVar26 * 4) = *puVar12;
            uVar11 = puVar7[uVar25];
          } while (uVar20 < uVar11);
          *(uint *)(auStack_f4 + uVar27 * 4 + -4) = uVar13;
        }
      }
      uVar21 = uVar11;
    } while (uVar25 < local_154);
  }
  lVar9 = 1;
  uVar25 = uVar6;
LAB_001140b3:
  do {
    uVar20 = (ulong)*(uint *)(auStack_134 + lVar9 * 4 + -4);
    if (uVar20 != 0) {
      uVar11 = *(uint *)(__vseblocks_possLogs + lVar9 * 4);
      lVar19 = local_b8[lVar9];
      uVar25 = 0;
      puVar12 = puVar15;
      do {
        uVar13 = *(uint *)(lVar19 + uVar25 * 4);
        uVar18 = (int)uVar6 + uVar11;
        *(uint *)(plVar8 + 1) = uVar18;
        uVar22 = (ulong)(uVar13 & ~(uint)(-1L << ((ulong)uVar11 & 0x3f))) |
                 uVar22 << ((ulong)uVar11 & 0x3f);
        puVar15 = puVar12;
        if (0x1f < uVar18) {
          puVar15 = puVar12 + 1;
          *plVar8 = (long)puVar15;
          *puVar12 = (uint32_t)(uVar22 >> ((ulong)(byte)((char)uVar18 - 0x20) & 0x3f));
          uVar16 = (int)plVar8[3] + 1;
          uVar18 = (int)plVar8[1] - 0x20;
          *(uint32_t *)(plVar8 + 3) = uVar16;
          *(uint *)(plVar8 + 1) = uVar18;
        }
        uVar6 = (ulong)uVar18;
        uVar25 = uVar25 + 1;
        puVar12 = puVar15;
      } while (uVar20 != uVar25);
      uVar25 = uVar6;
      if (uVar20 != 0) {
        if (uVar18 != 0) {
          if (uVar18 < 0x21) {
            iVar17 = 1;
            lVar23 = 4;
            lVar19 = uVar22 << ((ulong)-(uVar18 + 0x20) & 0x3f);
          }
          else {
            iVar17 = 2;
            lVar19 = uVar22 << ((ulong)(byte)-(char)uVar18 & 0x3f);
            *puVar15 = (uint32_t)((ulong)lVar19 >> 0x20);
            lVar23 = 8;
            puVar12 = puVar15 + 1;
          }
          puVar15 = (uint32_t *)((long)puVar15 + lVar23);
          *puVar12 = (uint32_t)lVar19;
          lVar9 = lVar9 + 1;
          uVar6 = 0;
          uVar22 = 0;
          uVar25 = 0;
          *plVar8 = (long)puVar15;
          uVar16 = iVar17 + (int)plVar8[3];
          *(uint32_t *)(plVar8 + 3) = uVar16;
          plVar8[2] = 0;
          *(undefined4 *)(plVar8 + 1) = 0;
          uVar20 = uVar25;
          if (lVar9 == 0x10) goto LAB_00114232;
          goto LAB_001140b3;
        }
        uVar6 = 0;
        uVar25 = 0;
      }
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x10);
  uVar11 = (uint)uVar25;
  uVar20 = uVar22;
  if (uVar11 != 0) {
    if (uVar11 < 0x21) {
      iVar17 = 1;
      lVar19 = 4;
      lVar9 = uVar22 << ((ulong)-(uVar11 + 0x20) & 0x3f);
      puVar12 = puVar15;
    }
    else {
      iVar17 = 2;
      lVar9 = uVar22 << ((ulong)(byte)-(char)uVar25 & 0x3f);
      *puVar15 = (uint32_t)((ulong)lVar9 >> 0x20);
      lVar19 = 8;
      puVar12 = puVar15 + 1;
    }
    puVar15 = (uint32_t *)((long)puVar15 + lVar19);
    *puVar12 = (uint32_t)lVar9;
    *plVar8 = (long)puVar15;
    uVar16 = iVar17 + (int)plVar8[3];
    *(uint32_t *)(plVar8 + 3) = uVar16;
    plVar8[2] = 0;
    uVar20 = 0;
  }
LAB_00114232:
  if (local_154 != 0) {
    auVar32 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar33 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    uVar11 = 0;
    uVar6 = 0;
    do {
      uVar13 = puVar7[uVar6];
      uVar18 = puVar7[uVar6 + 1];
      if (uVar13 < uVar18) {
        auVar41 = ZEXT1664((undefined1  [16])0x0);
        uVar22 = 0;
        auVar34 = vpbroadcastq_avx512f();
        do {
          auVar35 = vpbroadcastq_avx512f();
          auVar36 = vmovdqa64_avx512f(auVar41);
          auVar41 = vporq_avx512f(auVar35,auVar32);
          auVar35 = vporq_avx512f(auVar35,auVar33);
          uVar3 = vpcmpuq_avx512f(auVar35,auVar34,2);
          bVar4 = (byte)uVar3;
          uVar3 = vpcmpuq_avx512f(auVar41,auVar34,2);
          bVar5 = (byte)uVar3;
          uVar29 = CONCAT11(bVar5,bVar4);
          auVar41 = vmovdqu32_avx512f(*(undefined1 (*) [64])(local_150 + uVar13 + uVar22));
          auVar39._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * auVar41._4_4_;
          auVar39._0_4_ = (uint)(bVar4 & 1) * auVar41._0_4_;
          auVar39._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * auVar41._8_4_;
          auVar39._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * auVar41._12_4_;
          auVar39._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar41._16_4_;
          auVar39._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar41._20_4_;
          auVar39._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar41._24_4_;
          auVar39._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar41._28_4_;
          auVar39._32_4_ = (uint)(bVar5 & 1) * auVar41._32_4_;
          auVar39._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar41._36_4_;
          auVar39._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar41._40_4_;
          auVar39._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar41._44_4_;
          auVar39._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar41._48_4_;
          auVar39._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar41._52_4_;
          auVar39._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar41._56_4_;
          auVar39._60_4_ = (uint)(bVar5 >> 7) * auVar41._60_4_;
          uVar22 = uVar22 + 0x10;
          auVar41 = vpmaxud_avx512f(auVar36,auVar39);
        } while ((((ulong)uVar18 - (ulong)uVar13) + 0xf & 0xfffffffffffffff0) != uVar22);
        auVar34 = vmovdqa32_avx512f(auVar41);
        auVar40._0_4_ = (uint)(bVar4 & 1) * auVar34._0_4_ | (uint)!(bool)(bVar4 & 1) * auVar36._0_4_
        ;
        bVar1 = (bool)((byte)(uVar29 >> 1) & 1);
        auVar40._4_4_ = (uint)bVar1 * auVar34._4_4_ | (uint)!bVar1 * auVar36._4_4_;
        bVar1 = (bool)((byte)(uVar29 >> 2) & 1);
        auVar40._8_4_ = (uint)bVar1 * auVar34._8_4_ | (uint)!bVar1 * auVar36._8_4_;
        bVar1 = (bool)((byte)(uVar29 >> 3) & 1);
        auVar40._12_4_ = (uint)bVar1 * auVar34._12_4_ | (uint)!bVar1 * auVar36._12_4_;
        bVar1 = (bool)((byte)(uVar29 >> 4) & 1);
        auVar40._16_4_ = (uint)bVar1 * auVar34._16_4_ | (uint)!bVar1 * auVar36._16_4_;
        bVar1 = (bool)((byte)(uVar29 >> 5) & 1);
        auVar40._20_4_ = (uint)bVar1 * auVar34._20_4_ | (uint)!bVar1 * auVar36._20_4_;
        bVar1 = (bool)((byte)(uVar29 >> 6) & 1);
        auVar40._24_4_ = (uint)bVar1 * auVar34._24_4_ | (uint)!bVar1 * auVar36._24_4_;
        bVar1 = (bool)((byte)(uVar29 >> 7) & 1);
        auVar40._28_4_ = (uint)bVar1 * auVar34._28_4_ | (uint)!bVar1 * auVar36._28_4_;
        auVar40._32_4_ =
             (uint)(bVar5 & 1) * auVar34._32_4_ | (uint)!(bool)(bVar5 & 1) * auVar36._32_4_;
        bVar1 = (bool)(bVar5 >> 1 & 1);
        auVar40._36_4_ = (uint)bVar1 * auVar34._36_4_ | (uint)!bVar1 * auVar36._36_4_;
        bVar1 = (bool)(bVar5 >> 2 & 1);
        auVar40._40_4_ = (uint)bVar1 * auVar34._40_4_ | (uint)!bVar1 * auVar36._40_4_;
        bVar1 = (bool)(bVar5 >> 3 & 1);
        auVar40._44_4_ = (uint)bVar1 * auVar34._44_4_ | (uint)!bVar1 * auVar36._44_4_;
        bVar1 = (bool)(bVar5 >> 4 & 1);
        auVar40._48_4_ = (uint)bVar1 * auVar34._48_4_ | (uint)!bVar1 * auVar36._48_4_;
        bVar1 = (bool)(bVar5 >> 5 & 1);
        auVar40._52_4_ = (uint)bVar1 * auVar34._52_4_ | (uint)!bVar1 * auVar36._52_4_;
        bVar1 = (bool)(bVar5 >> 6 & 1);
        auVar40._56_4_ = (uint)bVar1 * auVar34._56_4_ | (uint)!bVar1 * auVar36._56_4_;
        auVar40._60_4_ =
             (uint)(bVar5 >> 7) * auVar34._60_4_ | (uint)!(bool)(bVar5 >> 7) * auVar36._60_4_;
        auVar31 = vextracti64x4_avx512f(auVar40,1);
        auVar34 = vpmaxud_avx512f(auVar40,ZEXT3264(auVar31));
        auVar30 = vpmaxud_avx(auVar34._0_16_,auVar34._16_16_);
        auVar2 = vpshufd_avx(auVar30,0xee);
        auVar30 = vpmaxud_avx(auVar30,auVar2);
        auVar2 = vpshufd_avx(auVar30,0x55);
        auVar30 = vpmaxud_avx(auVar30,auVar2);
        uVar24 = auVar30._0_4_;
        if (uVar24 == 0) goto LAB_0011434b;
        piVar28 = &__vseblocks_possLens;
        lVar9 = 0;
        do {
          if (uVar18 - uVar13 == *piVar28) goto LAB_00114341;
          lVar9 = lVar9 + 1;
          piVar28 = piVar28 + 1;
        } while (lVar9 != 0x10);
        lVar9 = 0;
LAB_00114341:
        uVar13 = (uint)lVar9;
      }
      else {
LAB_0011434b:
        piVar28 = &__vseblocks_posszLens;
        lVar9 = 0;
        do {
          if (uVar18 - uVar13 == *piVar28) goto LAB_0011436c;
          lVar9 = lVar9 + 1;
          piVar28 = piVar28 + 1;
        } while (lVar9 != 0x10);
        lVar9 = 0;
LAB_0011436c:
        uVar13 = (uint)lVar9;
        uVar24 = 0;
      }
      uVar18 = (&__vseblocks_codeLogs)[uVar24];
      uVar24 = uVar11 + 4;
      *(uint *)(plVar8 + 1) = uVar24;
      uVar22 = (ulong)(uVar18 & 0xf) | uVar20 << 4;
      puVar12 = puVar15;
      if (0x1f < uVar24) {
        puVar12 = puVar15 + 1;
        *plVar8 = (long)puVar12;
        *puVar15 = (uint32_t)(uVar22 >> ((ulong)(byte)((char)uVar11 - 0x1c) & 0x3f));
        uVar16 = (int)plVar8[3] + 1;
        uVar24 = (int)plVar8[1] - 0x20;
        *(uint32_t *)(plVar8 + 3) = uVar16;
      }
      uVar11 = uVar24 + 4;
      uVar20 = (ulong)(uVar13 & 0xf) | uVar22 << 4;
      *(uint *)(plVar8 + 1) = uVar11;
      puVar15 = puVar12;
      if (0x1f < uVar11) {
        puVar15 = puVar12 + 1;
        *plVar8 = (long)puVar15;
        *puVar12 = (uint32_t)(uVar20 >> ((ulong)(byte)((char)uVar24 - 0x1c) & 0x3f));
        uVar16 = (int)plVar8[3] + 1;
        uVar11 = (int)plVar8[1] - 0x20;
        *(uint32_t *)(plVar8 + 3) = uVar16;
        *(uint *)(plVar8 + 1) = uVar11;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < local_154);
    if (uVar11 != 0) {
      if (uVar11 < 0x21) {
        iVar17 = 1;
        lVar19 = 4;
        lVar9 = uVar20 << ((ulong)-(uVar11 + 0x20) & 0x3f);
        puVar12 = puVar15;
      }
      else {
        iVar17 = 2;
        lVar9 = uVar20 << ((ulong)(byte)-(char)uVar11 & 0x3f);
        *puVar15 = (uint32_t)((ulong)lVar9 >> 0x20);
        lVar19 = 8;
        puVar12 = puVar15 + 1;
      }
      *puVar12 = (uint32_t)lVar9;
      *plVar8 = (long)puVar15 + lVar19;
      uVar16 = iVar17 + (int)plVar8[3];
      *(uint32_t *)(plVar8 + 3) = uVar16;
    }
  }
  lVar9 = 0;
  do {
    if ((void *)local_b8[lVar9] != (void *)0x0) {
      operator_delete__((void *)local_b8[lVar9]);
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x10);
  if (puVar7 != (uint32_t *)0x0) {
    operator_delete__(puVar7);
  }
  operator_delete__(puVar14);
  *local_148 = uVar16;
  operator_delete(plVar8);
  return;
}

Assistant:

inline void VSEncodingBlocks::encodeVS(uint32_t len, const uint32_t *in,
                                uint32_t &size, uint32_t *out) {
  uint32_t i;
  uint32_t j;
  uint32_t *logs;
  uint32_t numBlocks;
  uint32_t maxB;
  uint32_t ntotal;
  uint32_t *part;
  uint32_t *blocks[VSEBLOCKS_LOGS_LEN];
  uint32_t blockCur[VSEBLOCKS_LOGS_LEN];
  uint32_t countBlocksLogs[VSEBLOCKS_LOGS_LEN];
  BitsWriter *wt;

  logs = new uint32_t[len];

  if (logs == NULL)
    fprintf(stderr, "Can't allocate memory\n");

  /* Compute logs of all numbers */
  for (i = 0; i < len; i++)
    logs[i] = __vseblocks_remapLogs[1 + asmbits(in[i])];

  /* Compute optimal partition */
  part = __vseblocks->compute_OptPartition(
      logs, len, VSEBLOCKS_LOGLEN + VSEBLOCKS_LOGLOG, numBlocks);

  /* Ready to write */
  wt = new BitsWriter(out);

  if (wt == NULL)
    fprintf(stderr, "Can't initialize a class\n");

  /* countBlocksLogs[i] says how many blocks uses i bits */
  for (i = 0; i < VSEBLOCKS_LOGS_LEN; i++) {
    countBlocksLogs[i] = 0;
    blockCur[i] = 0;
  }

  /* Count number of occs of each log */
  for (i = 0; i < numBlocks; i++) {
    /* Compute max B in the block */
    for (maxB = 0, j = part[i]; j < part[i + 1]; j++)
      if (maxB < logs[j])
        maxB = logs[j];

    countBlocksLogs[__vseblocks_codeLogs[maxB]] += part[i + 1] - part[i];
  }

  for (ntotal = 0, i = 1; i < VSEBLOCKS_LOGS_LEN; i++)
    if (countBlocksLogs[i] > 0)
      ntotal++;

  /* Write occs. zero is assumed to be present */
  wt->bit_writer(ntotal, 32);

  /* For each logs write it and the number of its occurrences */
  for (i = 1; i < VSEBLOCKS_LOGS_LEN; i++) {
    if (countBlocksLogs[i] > 0) {
      wt->bit_writer(countBlocksLogs[i], 28);
      wt->bit_writer(i, 4);
    }
  }

  /* Prepare arrays to store groups of elements */
  for (blocks[0] = 0, i = 1; i < VSEBLOCKS_LOGS_LEN; i++) {
    if (countBlocksLogs[i] > 0) {
      blocks[i] = new uint32_t[countBlocksLogs[i]];

      if (blocks[i] == NULL)
        fprintf(stderr, "Can't allocate memory\n");
    } else {
      blocks[i] = NULL;
    }
  }

  /* Permute the elements based on their values of B */
  for (i = 0; i < numBlocks; i++) {
    for (maxB = 0, j = part[i]; j < part[i + 1]; j++)
      if (maxB < logs[j])
        maxB = logs[j];

    if (!maxB)
      continue;

    for (j = part[i]; j < part[i + 1]; j++) {
      /* Save current element in its bucket */
      blocks[__vseblocks_codeLogs[maxB]][blockCur[__vseblocks_codeLogs[maxB]]] =
          in[j];
      blockCur[__vseblocks_codeLogs[maxB]]++;
    }
  }

  /* Write each bucket ... keeping byte alligment */
  for (i = 1; i < VSEBLOCKS_LOGS_LEN; i++) {
    for (j = 0; j < countBlocksLogs[i]; j++)
      wt->bit_writer(blocks[i][j], __vseblocks_possLogs[i]);

    /* Align to next word */
    if (countBlocksLogs[i] > 0)
      wt->bit_flush();
  }

  wt->bit_flush();

  /* write block codes... a byte each */
  for (i = 0; i < numBlocks; i++) {
    /* Compute max B in the block */
    for (j = part[i], maxB = 0; j < part[i + 1]; j++) {
      if (maxB < logs[j])
        maxB = logs[j];
    }

    if (maxB) {
      /* Compute the code for the block length */
      for (j = 0; j < VSEBLOCKS_LENS_LEN; j++) {
        if (part[i + 1] - part[i] == __vseblocks_possLens[j])
          break;
      }
    } else {
      /*
       * Treat runs of 0 in a different way.
       * Compute the code for the block length.
       */
      for (j = 0; j < VSEBLOCKS_LENS_LEN; j++) {
        if (part[i + 1] - part[i] == __vseblocks_posszLens[j])
          break;
      }
    }

    /* Writes the value of B and K */
    wt->bit_writer(__vseblocks_codeLogs[maxB], VSEBLOCKS_LOGLOG);
    wt->bit_writer(j, VSEBLOCKS_LOGLEN);
  }

  /* Align to 32-bit */
  wt->bit_flush();

  /* Finalization */
  for (i = 0; i < VSEBLOCKS_LOGS_LEN; i++)
    delete[] blocks[i];

  delete[] part;
  delete[] logs;

  size = wt->written;

  delete wt;
}